

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O2

void ear::checkScreenSpeakers(Layout *layout)

{
  pointer pCVar1;
  bool bVar2;
  vector<ear::Channel,_std::allocator<ear::Channel>_> *pvVar3;
  string *psVar4;
  not_implemented *this;
  invalid_argument *this_00;
  pointer this_01;
  double dVar5;
  allocator<char> local_51;
  string local_50;
  
  pvVar3 = Layout::channels(layout);
  this_01 = (pvVar3->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pCVar1 = (pvVar3->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (this_01 == pCVar1) {
      return;
    }
    psVar4 = Channel::name_abi_cxx11_(this_01);
    bVar2 = std::operator==(psVar4,"M+SC");
    if (bVar2) {
LAB_0014e794:
      Channel::polarPosition(this_01);
      dVar5 = ABS((double)local_50._M_dataplus._M_p);
      if (((dVar5 < 5.0) || (25.0 <= dVar5)) && ((dVar5 < 35.0 || (60.0 <= dVar5)))) {
        this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,
                   "M+SC or M-SC has azimuth not in the allowed ranges of 5 to 25 and 35 to 60 degrees"
                   ,&local_51);
        invalid_argument::invalid_argument(this_00,&local_50);
        __cxa_throw(this_00,&invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
      }
      if (25.0 < dVar5) {
        this = (not_implemented *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,
                   "M+SC and M-SC with azimuths wider than 25 degrees are not currently supported",
                   &local_51);
        not_implemented::not_implemented(this,&local_50);
        __cxa_throw(this,&not_implemented::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      psVar4 = Channel::name_abi_cxx11_(this_01);
      bVar2 = std::operator==(psVar4,"M-SC");
      if (bVar2) goto LAB_0014e794;
    }
    this_01 = this_01 + 1;
  } while( true );
}

Assistant:

void checkScreenSpeakers(const Layout& layout) {
    for (auto& channel : layout.channels()) {
      if (channel.name() == "M+SC" || channel.name() == "M-SC") {
        double abs_az = std::abs(channel.polarPosition().azimuth);
        if (!((5.0 <= abs_az && abs_az < 25.0) ||
              (35.0 <= abs_az && abs_az < 60.0))) {
          throw invalid_argument(
              "M+SC or M-SC has azimuth not in the allowed ranges of 5 to 25 "
              "and 35 to 60 degrees");
        }

        if (25.0 < abs_az) {
          throw not_implemented(
              "M+SC and M-SC with azimuths wider than 25 degrees are not "
              "currently supported");
        }
      }
    }
  }